

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  short sVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  BamAlignment *in_RSI;
  long in_RDI;
  float fVar12;
  char type;
  string tagName;
  size_t index;
  size_t tagDataLength;
  char *tagData;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarData;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffd18;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_stack_fffffffffffffd20;
  allocator *paVar13;
  string *in_stack_fffffffffffffd28;
  BadDataException *in_stack_fffffffffffffd30;
  int local_1b8;
  allocator local_1b1;
  string local_1b0 [16];
  size_t in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  ConvertToolPrivate *in_stack_fffffffffffffe70;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [39];
  char local_a1;
  string local_a0 [35];
  undefined1 local_7d;
  allocator local_69;
  string local_68 [32];
  _Alloc_hider *local_48;
  undefined1 *local_40;
  long local_38;
  reference local_30;
  CigarOp *local_28;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_20;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_18;
  BamAlignment *local_10;
  
  local_10 = in_RSI;
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)in_RSI);
  poVar6 = std::operator<<(poVar6,'\t');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->AlignmentFlag);
  std::operator<<(poVar6,'\t');
  if ((local_10->RefID < 0) ||
     (iVar4 = local_10->RefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), (int)sVar7 <= iVar4)) {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  else {
    pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8),(long)local_10->RefID);
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)pvVar8);
    std::operator<<(poVar6,'\t');
  }
  poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_10->Position + 1);
  poVar6 = std::operator<<(poVar6,'\t');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->MapQuality);
  std::operator<<(poVar6,'\t');
  local_18 = &local_10->CigarData;
  bVar1 = std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::empty
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffffd30);
  if (bVar1) {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  else {
    local_20._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   (in_stack_fffffffffffffd18);
    local_28 = (CigarOp *)
               std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                         (in_stack_fffffffffffffd18);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffd20,
                              (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffffd18), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                 ::operator*(&local_20);
      poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_30->Length);
      std::operator<<(poVar6,local_30->Type);
      __gnu_cxx::
      __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_20);
    }
    std::operator<<((ostream *)(in_RDI + 0x20),'\t');
  }
  bVar1 = BamAlignment::IsPaired(local_10);
  if (((bVar1) && (-1 < local_10->MateRefID)) &&
     (iVar4 = local_10->MateRefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), iVar4 < (int)sVar7)) {
    if (local_10->MateRefID == local_10->RefID) {
      std::operator<<((ostream *)(in_RDI + 0x20),"=\t");
    }
    else {
      pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                         ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                          (in_RDI + 8),(long)local_10->MateRefID);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)pvVar8);
      std::operator<<(poVar6,'\t');
    }
    poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_10->MatePosition + 1)
    ;
    poVar6 = std::operator<<(poVar6,'\t');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->InsertSize);
    std::operator<<(poVar6,'\t');
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t0\t0\t");
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)&local_10->QueryBases);
    std::operator<<(poVar6,'\t');
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  uVar9 = std::__cxx11::string::empty();
  if (((uVar9 & 1) == 0) &&
     (pcVar10 = (char *)std::__cxx11::string::at((ulong)&local_10->Qualities), *pcVar10 != -1)) {
    std::operator<<((ostream *)(in_RDI + 0x20),(string *)&local_10->Qualities);
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),'*');
  }
  local_38 = std::__cxx11::string::c_str();
  local_40 = (undefined1 *)std::__cxx11::string::length();
  local_48 = (_Alloc_hider *)0x0;
  do {
    if (local_40 <= local_48) break;
    if ((ulong)((long)local_40 - (long)local_48) < 4) {
      local_7d = 1;
      uVar11 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Incomplete tag data",&local_69);
      BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_7d = 0;
      __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
    }
    std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_10->TagData);
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'\t');
    poVar6 = std::operator<<(poVar6,local_a0);
    std::operator<<(poVar6,':');
    local_48 = local_48 + 2;
    pcVar10 = (char *)std::__cxx11::string::at((ulong)&local_10->TagData);
    local_a1 = *pcVar10;
    local_48 = local_48 + 1;
    switch(local_a1) {
    case 'A':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"A:");
      std::operator<<(poVar6,*(char *)(local_48 + local_38));
      local_48 = local_48 + 1;
      break;
    case 'B':
      std::operator<<((ostream *)(in_RDI + 0x20),"B:");
      in_stack_fffffffffffffd28 =
           (string *)
           PrintBArrayValues(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             in_stack_fffffffffffffe60);
      local_48 = &in_stack_fffffffffffffd28->_M_dataplus + (long)local_48;
      break;
    case 'C':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      std::ostream::operator<<(poVar6,(uint)*(byte *)(local_48 + local_38));
      local_48 = local_48 + 1;
      break;
    default:
      uVar11 = __cxa_allocate_exception(0x28);
      paVar13 = &local_1b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"Unknown tag type: ",paVar13);
      std::operator+(in_stack_fffffffffffffd28,(char)((ulong)paVar13 >> 0x38));
      BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
    case 'H':
    case 'Z':
      in_stack_fffffffffffffd30 =
           (BadDataException *)std::operator<<((ostream *)(in_RDI + 0x20),local_a1);
      std::operator<<((ostream *)in_stack_fffffffffffffd30,':');
      for (; *(char *)(local_48 + local_38) != '\0'; local_48 = local_48 + 1) {
        std::operator<<((ostream *)(in_RDI + 0x20),*(char *)(local_48 + local_38));
      }
      local_48 = local_48 + 1;
      break;
    case 'I':
      if ((ulong)((long)local_40 - (long)local_48) < 4) {
        local_142 = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"Incomplete tag data",&local_141);
        BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_142 = 0;
        __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      uVar5 = UnpackUnsignedInt((char *)(local_48 + local_38));
      std::ostream::operator<<(poVar6,uVar5);
      local_48 = local_48 + 4;
      break;
    case 'S':
      if ((ulong)((long)local_40 - (long)local_48) < 2) {
        local_f2 = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"Incomplete tag data",&local_f1);
        BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_f2 = 0;
        __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      uVar3 = UnpackUnsignedShort((char *)(local_48 + local_38));
      std::ostream::operator<<(poVar6,uVar3);
      local_48 = local_48 + 2;
      break;
    case 'c':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      std::ostream::operator<<(poVar6,(int)*(char *)(local_48 + local_38));
      local_48 = local_48 + 1;
      break;
    case 'f':
      if ((ulong)((long)local_40 - (long)local_48) < 4) {
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_168,"Incomplete tag data",&local_169);
        BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"f:");
      fVar12 = UnpackFloat((char *)(local_48 + local_38));
      std::ostream::operator<<(poVar6,fVar12);
      local_48 = local_48 + 4;
      break;
    case 'i':
      if ((ulong)((long)local_40 - (long)local_48) < 4) {
        local_11a = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,"Incomplete tag data",&local_119);
        BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_11a = 0;
        __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      iVar4 = UnpackSignedInt((char *)(local_48 + local_38));
      std::ostream::operator<<(poVar6,iVar4);
      local_48 = local_48 + 4;
      break;
    case 's':
      if ((ulong)((long)local_40 - (long)local_48) < 2) {
        local_ca = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"Incomplete tag data",&local_c9);
        BadDataException::BadDataException(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_ca = 0;
        __cxa_throw(uVar11,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      sVar2 = UnpackSignedShort((char *)(local_48 + local_38));
      std::ostream::operator<<(poVar6,sVar2);
      local_48 = local_48 + 2;
    }
    if ((local_48 < local_40) && (local_48[local_38] != (_Alloc_hider)0x0)) {
      local_1b8 = 0;
    }
    else {
      local_1b8 = 6;
    }
    std::__cxx11::string::~string(local_a0);
  } while (local_1b8 == 0);
  std::ostream::operator<<((void *)(in_RDI + 0x20),std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << m_references[a.RefID].RefName << '\t';
    } else {
        m_out << "*\t";
    }

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty()) {
        m_out << "*\t";
    } else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID) {
            m_out << "=\t";
        } else {
            m_out << m_references[a.MateRefID].RefName << '\t';
        }
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else {
        m_out << "*\t0\t0\t";
    }

    // write sequence
    if (a.QueryBases.empty()) {
        m_out << "*\t";
    } else {
        m_out << a.QueryBases << '\t';
    }

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF)) {
        m_out << '*';
    } else {
        m_out << a.Qualities;
    }

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // Need at least four bytes for a tag:
        //    two for name
        //    one for type
        //    at least one for value
        if (tagDataLength - index < 4) {
            throw BadDataException("Incomplete tag data");
        }

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<int8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<uint8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                if (tagDataLength - index < sizeof(int16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                if (tagDataLength - index < sizeof(uint16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                if (tagDataLength - index < sizeof(int32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                if (tagDataLength - index < sizeof(uint32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                if (tagDataLength - index < sizeof(float)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_ARRAY):
                m_out << "B:";
                index += PrintBArrayValues(tagData + index, tagDataLength - index);
                break;

            default:
                throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
        }

        if (index >= tagDataLength || tagData[index] == '\0') {
            break;
        }
    }

    m_out << std::endl;
}